

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::WriteEquals
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  char *text;
  FieldDescriptor *local_28;
  _func_void_FieldDescriptor_ptr *local_20;
  
  pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
  if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
    local_20 = FieldDescriptor::TypeOnceInit;
    local_28 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x18),&local_20,&local_28);
  }
  if (pFVar1[2] == (FieldDescriptor)0x2) {
    text = 
    "if (!pbc::ProtobufEqualityComparers.BitwiseSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n"
    ;
  }
  else {
    pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
    if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
      local_20 = FieldDescriptor::TypeOnceInit;
      local_28 = pFVar1;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar1 + 0x18),&local_20,&local_28);
    }
    text = "if ($property_name$ != other.$property_name$) return false;\n";
    if (pFVar1[2] == (FieldDescriptor)0x1) {
      text = 
      "if (!pbc::ProtobufEqualityComparers.BitwiseDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n"
      ;
    }
  }
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void PrimitiveFieldGenerator::WriteEquals(io::Printer* printer) {
  const char *text = "if ($property_name$ != other.$property_name$) return false;\n";
  if (descriptor_->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  } else if (descriptor_->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  printer->Print(variables_, text);
}